

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O0

void child(void)

{
  byte bVar1;
  uint uVar2;
  Reader *__p;
  Writer *__p_00;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  ostream *this;
  bool is_last_message;
  Message *message_pointer;
  undefined1 local_a0 [8];
  vector<char,_std::allocator<char>_> data;
  string local_80;
  undefined1 local_60 [8];
  shared_ptr<diffusion::Writer> in_writer;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [8];
  shared_ptr<diffusion::Reader> out_reader;
  
  pcVar4 = shm_out_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar4,&local_39);
  __p = diffusion::create_shared_memory_reader(&local_38);
  std::shared_ptr<diffusion::Reader>::shared_ptr<diffusion::Reader,void>
            ((shared_ptr<diffusion::Reader> *)local_18,__p);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar4 = shm_in_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,pcVar4,
             (allocator<char> *)
             &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  __p_00 = diffusion::create_shared_memory_writer(&local_80,0x1000000);
  std::shared_ptr<diffusion::Writer>::shared_ptr<diffusion::Writer,void>
            ((shared_ptr<diffusion::Writer> *)local_60,__p_00);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_a0,0x1e8,
             (allocator_type *)((long)&message_pointer + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&message_pointer + 7));
  do {
    do {
      peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_18);
      uVar2 = (**peVar3->_vptr_Reader)();
    } while ((uVar2 & 1) == 0);
    peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
    (*peVar3->_vptr_Reader[2])(peVar3,local_a0);
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_a0);
    *(int *)(pcVar4 + 0x1e0) = *(int *)(pcVar4 + 0x1e0) + 1;
    bVar1 = pcVar4[0x1e4];
    peVar5 = std::__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_60);
    (**peVar5->_vptr_Writer)(peVar5,(vector<char,_std::allocator<char>_> *)local_a0);
  } while ((bVar1 & 1) == 0);
  this = std::operator<<((ostream *)&std::cout,"Child process terminated");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_a0)
  ;
  std::shared_ptr<diffusion::Writer>::~shared_ptr((shared_ptr<diffusion::Writer> *)local_60);
  std::shared_ptr<diffusion::Reader>::~shared_ptr((shared_ptr<diffusion::Reader> *)local_18);
  return;
}

Assistant:

void child() {
    auto out_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_shared_memory_reader(shm_out_name));
    auto in_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_shared_memory_writer(shm_in_name, shm_size));
    std::vector<char> data(sizeof(Message));
    while (true) {
        if (out_reader->can_read()) {
            out_reader->read(data);
            auto message_pointer = reinterpret_cast<Message *>(data.data());
            ++message_pointer->num_passes;
            bool is_last_message = message_pointer->is_last_message;
            in_writer->write(data);
            if (is_last_message) {
                break;
            }
        }
    }
    std::cout << "Child process terminated" << std::endl;
}